

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Strash(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pBoxes;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Gia_Man_t *p;
  char *pcVar5;
  Gia_Man_t *pUnshuffled;
  int fRehashMap;
  int fStrMuxes;
  int fAddMuxes;
  int fCollapse;
  int fAddStrash;
  int Limit;
  int c;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fCollapse = 2;
  fAddMuxes = 0;
  bVar3 = false;
  fRehashMap = 0;
  bVar1 = false;
  bVar2 = false;
  Extra_UtilGetoptReset();
  do {
    iVar4 = Extra_UtilGetopt(argc,argv,"Lacmrsh");
    if (iVar4 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Strash(): There is no AIG.\n");
        return 1;
      }
      if (bVar1) {
        iVar4 = Gia_ManHasMapping(pAbc->pGia);
        if (iVar4 != 0) {
          Abc_Print(0,"Restructing the current AIG destroys the LUT mapping.\n");
        }
        Vec_IntFreeP(&pAbc->pGia->vMapping);
        _Limit = Gia_ManDupMuxRestructure(pAbc->pGia);
        Abc_Print(1,
                  "Finished AIG restructing to enable efficient mapping of 4:1 MUXes into 4-LUTs.\n"
                 );
      }
      else {
        iVar4 = Gia_ManHasMapping(pAbc->pGia);
        if ((iVar4 == 0) || (!bVar2)) {
          iVar4 = Gia_ManHasMapping(pAbc->pGia);
          if ((iVar4 == 0) || (pAbc->pGia->vConfigs == (Vec_Int_t *)0x0)) {
            iVar4 = Gia_ManHasMapping(pAbc->pGia);
            if (iVar4 == 0) {
              if (fRehashMap == 0) {
                if ((bVar3) && (pAbc->pGia->pAigExtra != (Gia_Man_t *)0x0)) {
                  iVar4 = Gia_ManBufNum(pAbc->pGia);
                  if (iVar4 != 0) {
                    __assert_fail("!Gia_ManBufNum(pAbc->pGia)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abc.c"
                                  ,0x7d61,"int Abc_CommandAbc9Strash(Abc_Frame_t *, int, char **)");
                  }
                  iVar4 = Gia_ManIsSeqWithBoxes(pAbc->pGia);
                  if ((iVar4 == 0) && (iVar4 = Gia_ManRegBoxNum(pAbc->pGia), iVar4 == 0)) {
                    _Limit = Gia_ManDupCollapse(pAbc->pGia,pAbc->pGia->pAigExtra,(Vec_Int_t *)0x0,0)
                    ;
                  }
                  else {
                    p = Gia_ManDupUnshuffleInputs(pAbc->pGia);
                    Gia_ManTransferTiming(p,pAbc->pGia);
                    pBoxes = p->pAigExtra;
                    iVar4 = Gia_ManRegBoxNum(p);
                    _Limit = Gia_ManDupCollapse(p,pBoxes,(Vec_Int_t *)0x0,(uint)(0 < iVar4));
                    Gia_ManTransferTiming(pAbc->pGia,p);
                    Gia_ManStop(p);
                  }
                  pcVar5 = Abc_FrameReadFlag("silentmode");
                  if (pcVar5 == (char *)0x0) {
                    printf("Collapsed AIG with boxes and logic of the boxes.\n");
                  }
                }
                else if (pAbc->pGia->pMuxes == (uint *)0x0) {
                  _Limit = Gia_ManRehash(pAbc->pGia,fAddMuxes);
                }
                else {
                  _Limit = Gia_ManDupNoMuxes(pAbc->pGia,0);
                  pcVar5 = Abc_FrameReadFlag("silentmode");
                  if (pcVar5 == (char *)0x0) {
                    printf("Generated AIG from AND/XOR/MUX graph.\n");
                  }
                }
              }
              else {
                if (pAbc->pGia->pMuxes != (uint *)0x0) {
                  Abc_Print(-1,"Abc_CommandAbc9Strash(): The AIG already has MUXes.\n");
                  return 1;
                }
                _Limit = Gia_ManDupMuxes(pAbc->pGia,fCollapse);
                pcVar5 = Abc_FrameReadFlag("silentmode");
                if (pcVar5 == (char *)0x0) {
                  printf("Generated AND/XOR/MUX graph.\n");
                }
              }
            }
            else {
              _Limit = (Gia_Man_t *)Dsm_ManDeriveGia(pAbc->pGia,fRehashMap);
            }
          }
          else {
            _Limit = (Gia_Man_t *)If_ManDeriveGiaFromCells(pAbc->pGia);
          }
        }
        else {
          _Limit = Gia_ManDupHashMapping(pAbc->pGia);
          Gia_ManTransferPacking(_Limit,pAbc->pGia);
          Gia_ManTransferTiming(_Limit,pAbc->pGia);
        }
      }
      if ((!bVar3) || (pAbc->pGia->pAigExtra == (Gia_Man_t *)0x0)) {
        Gia_ManTransferTiming(_Limit,pAbc->pGia);
        pAbc->pGia->vConfigs = _Limit->vConfigs;
        _Limit->vConfigs = (Vec_Int_t *)0x0;
        pAbc->pGia->pCellStr = _Limit->pCellStr;
        _Limit->pCellStr = (char *)0x0;
      }
      Abc_FrameUpdateGia(pAbc,_Limit);
      return 0;
    }
    switch(iVar4) {
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
        goto LAB_002a1f8b;
      }
      fCollapse = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (fCollapse < 0) {
LAB_002a1f8b:
        Abc_Print(-2,"usage: &st [-L num] [-acmrsh]\n");
        Abc_Print(-2,"\t         performs structural hashing\n");
        pcVar5 = "no";
        if (fAddMuxes != 0) {
          pcVar5 = "yes";
        }
        Abc_Print(-2,"\t-a     : toggle additional hashing [default = %s]\n",pcVar5);
        pcVar5 = "no";
        if (bVar3) {
          pcVar5 = "yes";
        }
        Abc_Print(-2,"\t-c     : toggle collapsing hierarchical AIG [default = %s]\n",pcVar5);
        pcVar5 = "no";
        if (fRehashMap != 0) {
          pcVar5 = "yes";
        }
        Abc_Print(-2,"\t-m     : toggle converting to larger gates [default = %s]\n",pcVar5);
        Abc_Print(-2,
                  "\t-L num : create MUX when sum of refs does not exceed this limit [default = %d]\n"
                  ,(ulong)(uint)fCollapse);
        Abc_Print(-2,"\t         (use L = 1 to create AIG with XORs but without MUXes)\n");
        pcVar5 = "no";
        if (bVar2) {
          pcVar5 = "yes";
        }
        Abc_Print(-2,"\t-r     : toggle rehashing AIG while preserving mapping [default = %s]\n",
                  pcVar5);
        pcVar5 = "no";
        if (bVar1) {
          pcVar5 = "yes";
        }
        Abc_Print(-2,"\t-s     : toggle using MUX restructuring [default = %s]\n",pcVar5);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      break;
    default:
      goto LAB_002a1f8b;
    case 0x61:
      fAddMuxes = fAddMuxes ^ 1;
      break;
    case 99:
      bVar3 = (bool)(bVar3 ^ 1);
      break;
    case 0x68:
      goto LAB_002a1f8b;
    case 0x6d:
      fRehashMap = fRehashMap ^ 1;
      break;
    case 0x72:
      bVar2 = (bool)(bVar2 ^ 1);
      break;
    case 0x73:
      bVar1 = (bool)(bVar1 ^ 1);
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Strash( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManDupMuxRestructure( Gia_Man_t * p );
    Gia_Man_t * pTemp;
    int c, Limit = 2;
    int fAddStrash = 0;
    int fCollapse = 0;
    int fAddMuxes = 0;
    int fStrMuxes = 0;
    int fRehashMap = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Lacmrsh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            Limit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Limit < 0 )
                goto usage;
            break;
        case 'a':
            fAddStrash ^= 1;
            break;
        case 'c':
            fCollapse ^= 1;
            break;
        case 'm':
            fAddMuxes ^= 1;
            break;
        case 'r':
            fRehashMap ^= 1;
            break;
        case 's':
            fStrMuxes ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Strash(): There is no AIG.\n" );
        return 1;
    }
    if ( fStrMuxes )
    {
        if ( Gia_ManHasMapping(pAbc->pGia) )
            Abc_Print( 0, "Restructing the current AIG destroys the LUT mapping.\n" );
        Vec_IntFreeP( &pAbc->pGia->vMapping );
        pTemp = Gia_ManDupMuxRestructure( pAbc->pGia );
        Abc_Print( 1, "Finished AIG restructing to enable efficient mapping of 4:1 MUXes into 4-LUTs.\n" );
    }
    else if ( Gia_ManHasMapping(pAbc->pGia) && fRehashMap )
    {
        pTemp = Gia_ManDupHashMapping( pAbc->pGia );
        Gia_ManTransferPacking( pTemp, pAbc->pGia );
        Gia_ManTransferTiming( pTemp, pAbc->pGia );
    }
    else if ( Gia_ManHasMapping(pAbc->pGia) && pAbc->pGia->vConfigs )
        pTemp = (Gia_Man_t *)If_ManDeriveGiaFromCells( pAbc->pGia );
    else if ( Gia_ManHasMapping(pAbc->pGia) )
        pTemp = (Gia_Man_t *)Dsm_ManDeriveGia( pAbc->pGia, fAddMuxes ); // delay-oriented unmapping
    else if ( fAddMuxes )
    {
        if ( pAbc->pGia->pMuxes )
        {
            Abc_Print( -1, "Abc_CommandAbc9Strash(): The AIG already has MUXes.\n" );
            return 1;
        }
        pTemp = Gia_ManDupMuxes( pAbc->pGia, Limit );
        if ( !Abc_FrameReadFlag("silentmode") )
            printf( "Generated AND/XOR/MUX graph.\n" );
    }
    else if ( fCollapse && pAbc->pGia->pAigExtra )
    {
        assert( !Gia_ManBufNum(pAbc->pGia) );
        if ( Gia_ManIsSeqWithBoxes(pAbc->pGia) || Gia_ManRegBoxNum(pAbc->pGia) )
        {
            Gia_Man_t * pUnshuffled = Gia_ManDupUnshuffleInputs( pAbc->pGia );
            Gia_ManTransferTiming( pUnshuffled, pAbc->pGia );
            pTemp = Gia_ManDupCollapse( pUnshuffled, pUnshuffled->pAigExtra, NULL, Gia_ManRegBoxNum(pUnshuffled) > 0 );
            Gia_ManTransferTiming( pAbc->pGia, pUnshuffled );
            Gia_ManStop( pUnshuffled );
        }
        else
            pTemp = Gia_ManDupCollapse( pAbc->pGia, pAbc->pGia->pAigExtra, NULL, 0 );
        if ( !Abc_FrameReadFlag("silentmode") )
            printf( "Collapsed AIG with boxes and logic of the boxes.\n" );
    }
    else if ( pAbc->pGia->pMuxes )
    {
        pTemp = Gia_ManDupNoMuxes( pAbc->pGia, 0 );
        if ( !Abc_FrameReadFlag("silentmode") )
            printf( "Generated AIG from AND/XOR/MUX graph.\n" );
    }
    else
    {
        pTemp = Gia_ManRehash( pAbc->pGia, fAddStrash );
//        if ( !Abc_FrameReadFlag("silentmode") )
//            printf( "Rehashed the current AIG.\n" );
    }
    if ( !(fCollapse && pAbc->pGia->pAigExtra) )
    {
        Gia_ManTransferTiming( pTemp, pAbc->pGia );
        pAbc->pGia->vConfigs = pTemp->vConfigs;     pTemp->vConfigs = NULL;
        pAbc->pGia->pCellStr = pTemp->pCellStr;     pTemp->pCellStr = NULL;
    }
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &st [-L num] [-acmrsh]\n" );
    Abc_Print( -2, "\t         performs structural hashing\n" );
    Abc_Print( -2, "\t-a     : toggle additional hashing [default = %s]\n", fAddStrash? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle collapsing hierarchical AIG [default = %s]\n", fCollapse? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle converting to larger gates [default = %s]\n", fAddMuxes? "yes": "no" );
    Abc_Print( -2, "\t-L num : create MUX when sum of refs does not exceed this limit [default = %d]\n", Limit );
    Abc_Print( -2, "\t         (use L = 1 to create AIG with XORs but without MUXes)\n" );
    Abc_Print( -2, "\t-r     : toggle rehashing AIG while preserving mapping [default = %s]\n", fRehashMap? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle using MUX restructuring [default = %s]\n", fStrMuxes? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}